

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::ArrayBuilder<kj::(anonymous_namespace)::MockConnectionReceiver::ClientRequest>::~ArrayBuilder
          (ArrayBuilder<kj::(anonymous_namespace)::MockConnectionReceiver::ClientRequest> *this)

{
  ClientRequest *pCVar1;
  RemoveConst<kj::(anonymous_namespace)::MockConnectionReceiver::ClientRequest> *pRVar2;
  ClientRequest *pCVar3;
  
  pCVar1 = this->ptr;
  if (pCVar1 != (ClientRequest *)0x0) {
    pRVar2 = this->pos;
    pCVar3 = this->endPtr;
    this->ptr = (ClientRequest *)0x0;
    this->pos = (RemoveConst<kj::(anonymous_namespace)::MockConnectionReceiver::ClientRequest> *)0x0
    ;
    this->endPtr = (ClientRequest *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pCVar1,0x1a8,((long)pRVar2 - (long)pCVar1 >> 3) * 0x21cfb2b78c13521d,
               ((long)pCVar3 - (long)pCVar1 >> 3) * 0x21cfb2b78c13521d,
               ArrayDisposer::
               Dispose_<kj::(anonymous_namespace)::MockConnectionReceiver::ClientRequest>::destruct)
    ;
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }